

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_qx_dispatch.c
# Opt level: O1

parasail_result_t *
parasail_sg_qx_rowcol_striped_profile_32_dispatcher
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  parasail_result_t *ppVar2;
  
  iVar1 = parasail_can_use_avx2();
  if (iVar1 == 0) {
    iVar1 = parasail_can_use_sse41();
    if (iVar1 == 0) {
      iVar1 = parasail_can_use_sse2();
      if (iVar1 == 0) {
        return (parasail_result_t *)0x0;
      }
      UNRECOVERED_JUMPTABLE = parasail_sg_qx_rowcol_striped_profile_sse2_128_32;
    }
    else {
      UNRECOVERED_JUMPTABLE = parasail_sg_qx_rowcol_striped_profile_sse41_128_32;
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = parasail_sg_qx_rowcol_striped_profile_avx2_256_32;
  }
  parasail_sg_qx_rowcol_striped_profile_32_pointer = UNRECOVERED_JUMPTABLE;
  ppVar2 = (*UNRECOVERED_JUMPTABLE)(profile,s2,s2Len,open,gap);
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_sg_qx_rowcol_striped_profile_32_dispatcher(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
#if HAVE_AVX2
    if (parasail_can_use_avx2()) {
        parasail_sg_qx_rowcol_striped_profile_32_pointer = parasail_sg_qx_rowcol_striped_profile_avx2_256_32;
    }
    else
#endif
#if HAVE_SSE41
    if (parasail_can_use_sse41()) {
        parasail_sg_qx_rowcol_striped_profile_32_pointer = parasail_sg_qx_rowcol_striped_profile_sse41_128_32;
    }
    else
#endif
#if HAVE_SSE2
    if (parasail_can_use_sse2()) {
        parasail_sg_qx_rowcol_striped_profile_32_pointer = parasail_sg_qx_rowcol_striped_profile_sse2_128_32;
    }
    else
#endif
#if HAVE_ALTIVEC
    if (parasail_can_use_altivec()) {
        parasail_sg_qx_rowcol_striped_profile_32_pointer = parasail_sg_qx_rowcol_striped_profile_altivec_128_32;
    }
    else
#endif
#if HAVE_NEON
    if (parasail_can_use_neon()) {
        parasail_sg_qx_rowcol_striped_profile_32_pointer = parasail_sg_qx_rowcol_striped_profile_neon_128_32;
    }
    else
#endif
    {
        /* no fallback; caller must check for non-NULL result */
        return NULL;
    }
    return parasail_sg_qx_rowcol_striped_profile_32_pointer(profile, s2, s2Len, open, gap);
}